

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlibrary_unix.cpp
# Opt level: O1

bool __thiscall QLibraryPrivate::unload_sys(QLibraryPrivate *this)

{
  int iVar1;
  QArrayData *data;
  char16_t *pcVar2;
  qsizetype qVar3;
  DataPointer *pDVar4;
  int iVar5;
  long lVar6;
  QString *pQVar7;
  storage_type *psVar8;
  QString *this_00;
  long in_FS_OFFSET;
  QByteArrayView ba;
  QString local_78;
  QString local_60;
  type local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  iVar5 = dlclose((this->pHnd).super_QBasicAtomicPointer<void>._q_value._M_b._M_p);
  if (iVar5 == 0) {
    if ((this->errorString).d.ptr == (char16_t *)0x0) goto LAB_004a82ee;
    local_60.d.d = (this->errorString).d.d;
    (this->errorString).d.d = (Data *)0x0;
    (this->errorString).d.ptr = (char16_t *)0x0;
    (this->errorString).d.size = 0;
    if (&(local_60.d.d)->super_QArrayData == (QArrayData *)0x0) goto LAB_004a82ee;
    LOCK();
    ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    iVar1 = ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
    UNLOCK();
  }
  else {
    lVar6 = dlerror();
    this_00 = (QString *)0x0;
    psVar8 = (storage_type *)0x0;
    QMetaObject::tr(&local_60,&QLibrary::staticMetaObject,"Cannot unload library %1: %2",(char *)0x0
                    ,-1);
    if (lVar6 != 0) {
      pQVar7 = (QString *)0xffffffffffffffff;
      do {
        this_00 = (QString *)((long)&(pQVar7->d).d + 1);
        pDVar4 = &pQVar7->d;
        pQVar7 = this_00;
      } while (*(char *)((long)&pDVar4->d + lVar6 + 1) != '\0');
    }
    ba.m_data = psVar8;
    ba.m_size = lVar6;
    QString::fromLocal8Bit(&local_78,this_00,ba);
    QString::arg<QString_const&,QString>(&local_48,&local_60,&this->fileName,&local_78);
    data = &((this->errorString).d.d)->super_QArrayData;
    pcVar2 = (this->errorString).d.ptr;
    (this->errorString).d.d = local_48.d.d;
    (this->errorString).d.ptr = local_48.d.ptr;
    qVar3 = (this->errorString).d.size;
    (this->errorString).d.size = local_48.d.size;
    local_48.d.d = (Data *)data;
    local_48.d.ptr = pcVar2;
    local_48.d.size = qVar3;
    if (data != (QArrayData *)0x0) {
      LOCK();
      (data->ref_)._q_value.super___atomic_base<int>._M_i =
           (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(data,2,0x10);
      }
    }
    if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_60.d.d)->super_QArrayData == (QArrayData *)0x0) goto LAB_004a82ee;
    LOCK();
    ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    iVar1 = ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
    UNLOCK();
  }
  if (iVar1 == 0) {
    QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,2,0x10);
  }
LAB_004a82ee:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return iVar5 == 0;
  }
  __stack_chk_fail();
}

Assistant:

bool QLibraryPrivate::unload_sys()
{
    bool doTryUnload = true;
#ifndef RTLD_NODELETE
    if (loadHints() & QLibrary::PreventUnloadHint)
        doTryUnload = false;
#endif
    if (doTryUnload && dlclose(pHnd.loadAcquire())) {
        const char *error = dlerror();
#if defined (Q_OS_QNX)
        // Workaround until fixed in QNX; fixes crash in
        // QtDeclarative auto test "qqmlenginecleanup" for instance
        if (!qstrcmp(error, "Shared objects still referenced")) // On QNX that's only "informative"
            return true;
#endif
        errorString = QLibrary::tr("Cannot unload library %1: %2")
                .arg(fileName, QString::fromLocal8Bit(error));
        return false;
    }
    errorString.clear();
    return true;
}